

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void __thiscall tst_qpromise_map::functorThrows(tst_qpromise_map *this)

{
  initializer_list<int> args;
  Type TVar1;
  QString local_c0;
  QString local_a8;
  QString local_90;
  int local_64 [3];
  iterator local_58;
  undefined8 local_50;
  QList<int> local_48;
  QPromise<QList<int>_> local_30;
  undefined1 local_20 [8];
  PromiseType p;
  tst_qpromise_map *this_local;
  
  local_64[0] = 0x2a;
  local_64[1] = 0x2b;
  local_64[2] = 0x2c;
  local_58 = local_64;
  local_50 = 3;
  args._M_len = 3;
  args._M_array = local_58;
  p.super_QPromiseBase<QList<int>_>.m_d.d = (PromiseData<QList<int>_> *)this;
  QList<int>::QList(&local_48,args);
  TVar1 = QtPromise::resolve<QList<int>>((QtPromise *)&local_30,&local_48);
  QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::functorThrows()::__0>
            ((QPromise<QList<int>> *)local_20,&local_30,
             TVar1.super_QPromiseBase<QList<int>_>.m_d.d.d);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_30);
  QList<int>::~QList(&local_48);
  QString::QString(&local_a8);
  waitForError<QList<int>,QString>(&local_90,(QPromise<QList<int>_> *)local_20,&local_a8);
  QString::QString(&local_c0,"foo");
  QTest::qCompare(&local_90,&local_c0,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
                  ,0x85);
  QString::~QString(&local_c0);
  QString::~QString(&local_90);
  QString::~QString(&local_a8);
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_20);
  return;
}

Assistant:

void tst_qpromise_map::functorThrows()
{
    auto p = QtPromise::resolve(QVector<int>{42, 43, 44}).map([](int v, ...) {
        if (v == 43) {
            throw QString{"foo"};
        }
        return v + 1;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
}